

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_junit_xml_tests.cpp
# Opt level: O0

int iu_ParamTest_x_iutest_x_Test_Test::AddRegister(void)

{
  int iVar1;
  UnitTest *this;
  ParamTestSuiteHolder *this_00;
  ParamTestSuiteInfo<ParamTest> *this_01;
  string local_60;
  allocator<char> local_39;
  string local_38;
  
  if (AddRegister()::testinfo == '\0') {
    iVar1 = __cxa_guard_acquire(&AddRegister()::testinfo);
    if (iVar1 != 0) {
      iutest::detail::ParamTestInstance<iu_ParamTest_x_iutest_x_Test_Test>::ParamTestInstance
                (&AddRegister::testinfo,"Test");
      __cxa_atexit(iutest::detail::ParamTestInstance<iu_ParamTest_x_iutest_x_Test_Test>::
                   ~ParamTestInstance,&AddRegister::testinfo,&__dso_handle);
      __cxa_guard_release(&AddRegister()::testinfo);
    }
  }
  this = iutest::UnitTest::GetInstance();
  this_00 = iutest::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ParamTest",&local_39);
  iuTest_GetTestSuitePackageName<iuTest_TestSuitePackage>(&local_60,(iuTest_TestSuitePackage *)0x0);
  this_01 = iutest::detail::ParamTestSuiteHolder::GetTestSuitePatternHolder<ParamTest>
                      (this_00,&local_38,&local_60);
  iutest::detail::IParamTestSuiteInfo::AddTestPattern
            (&this_01->super_IParamTestSuiteInfo,&AddRegister::testinfo.super_IParamTestInfoData);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return 0;
}

Assistant:

IUTEST_P(ParamTest, Test)
{
}